

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel.h
# Opt level: O2

void __thiscall Dashel::Stream::~Stream(Stream *this)

{
  this->_vptr_Stream = (_func_int **)&PTR__Stream_001256d8;
  std::__cxx11::string::~string((string *)&this->protocolName);
  ParameterSet::~ParameterSet(&this->target);
  std::__cxx11::string::~string((string *)&this->failReason);
  return;
}

Assistant:

virtual ~Stream() { /* intentionally blank */}